

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::AddGlobalTarget_Package
          (cmGlobalGenerator *this,
          vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          *targets)

{
  cmMakefile *this_00;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  reference ppcVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar5;
  string *__x;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  allocator local_229;
  value_type local_228;
  allocator local_201;
  string local_200;
  char *local_1e0;
  char *noPackageAll;
  value_type local_1d0;
  allocator local_1a9;
  undefined1 local_1a8 [8];
  string relConfigFile;
  string local_180 [8];
  string configFile;
  value_type local_158;
  allocator local_131;
  value_type local_130;
  allocator local_109;
  value_type local_108;
  undefined1 local_e8 [8];
  cmCustomCommandLine singleLine;
  undefined1 local_c0 [8];
  GlobalTargetInfo gti;
  char *cmakeCfgIntDir;
  cmMakefile *mf;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  *targets_local;
  cmGlobalGenerator *this_local;
  
  ppcVar4 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::operator[](&this->Makefiles,0)
  ;
  this_00 = *ppcVar4;
  gti._144_4_ = (*this->_vptr_cmGlobalGenerator[0xf])();
  gti._148_4_ = extraout_var;
  GlobalTargetInfo::GlobalTargetInfo((GlobalTargetInfo *)local_c0);
  iVar3 = (*this->_vptr_cmGlobalGenerator[0x19])();
  std::__cxx11::string::operator=((string *)local_c0,(char *)CONCAT44(extraout_var_00,iVar3));
  std::__cxx11::string::operator=
            ((string *)(gti.Name.field_2._M_local_buf + 8),"Run CPack packaging tool...");
  gti.WorkingDir.field_2._M_local_buf[8] = '\x01';
  pcVar5 = cmMakefile::GetCurrentBinaryDirectory(this_00);
  std::__cxx11::string::operator=
            ((string *)
             &gti.Depends.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar5);
  cmCustomCommandLine::cmCustomCommandLine((cmCustomCommandLine *)local_e8);
  __x = cmSystemTools::GetCPackCommand_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_e8,__x);
  if (((gti._144_8_ != 0) && (*(char *)gti._144_8_ != '\0')) && (*(char *)gti._144_8_ != '.')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_108,"-C",&local_109);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_e8,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    uVar1 = gti._144_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_130,(char *)uVar1,&local_131);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_e8,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_158,"--config",(allocator *)(configFile.field_2._M_local_buf + 0xf));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_e8,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)(configFile.field_2._M_local_buf + 0xf));
  pcVar5 = cmMakefile::GetCurrentBinaryDirectory(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_180,pcVar5,(allocator *)(relConfigFile.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(relConfigFile.field_2._M_local_buf + 0xf));
  std::__cxx11::string::operator+=(local_180,"/CPackConfig.cmake");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_1a8,"./CPackConfig.cmake",&local_1a9);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_e8,(value_type *)local_1a8);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
            ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
             ((long)&gti.Message.field_2 + 8),(value_type *)local_e8);
  iVar3 = (*this->_vptr_cmGlobalGenerator[0x17])();
  if (CONCAT44(extraout_var_01,iVar3) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_200,"CMAKE_SKIP_PACKAGE_ALL_DEPENDENCY",&local_201);
    pcVar5 = cmMakefile::GetDefinition(this_00,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
    local_1e0 = pcVar5;
    if ((pcVar5 == (char *)0x0) || (bVar2 = cmSystemTools::IsOff(pcVar5), bVar2)) {
      iVar3 = (*this->_vptr_cmGlobalGenerator[0x13])();
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_228,(char *)CONCAT44(extraout_var_03,iVar3),&local_229);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gti.CommandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                      super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      std::allocator<char>::~allocator((allocator<char> *)&local_229);
    }
  }
  else {
    iVar3 = (*this->_vptr_cmGlobalGenerator[0x17])();
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1d0,(char *)CONCAT44(extraout_var_02,iVar3),
               (allocator *)((long)&noPackageAll + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gti.CommandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&noPackageAll + 7));
  }
  pcVar5 = (char *)std::__cxx11::string::c_str();
  bVar2 = cmsys::SystemTools::FileExists(pcVar5);
  if (bVar2) {
    std::
    vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
    ::push_back(targets,(value_type *)local_c0);
  }
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::string::~string(local_180);
  cmCustomCommandLine::~cmCustomCommandLine((cmCustomCommandLine *)local_e8);
  GlobalTargetInfo::~GlobalTargetInfo((GlobalTargetInfo *)local_c0);
  return;
}

Assistant:

void cmGlobalGenerator::AddGlobalTarget_Package(
  std::vector<GlobalTargetInfo>& targets)
{
  cmMakefile* mf = this->Makefiles[0];
  const char* cmakeCfgIntDir = this->GetCMakeCFGIntDir();
  GlobalTargetInfo gti;
  gti.Name = this->GetPackageTargetName();
  gti.Message = "Run CPack packaging tool...";
  gti.UsesTerminal = true;
  gti.WorkingDir = mf->GetCurrentBinaryDirectory();
  cmCustomCommandLine singleLine;
  singleLine.push_back(cmSystemTools::GetCPackCommand());
  if (cmakeCfgIntDir && *cmakeCfgIntDir && cmakeCfgIntDir[0] != '.') {
    singleLine.push_back("-C");
    singleLine.push_back(cmakeCfgIntDir);
  }
  singleLine.push_back("--config");
  std::string configFile = mf->GetCurrentBinaryDirectory();
  configFile += "/CPackConfig.cmake";
  std::string relConfigFile = "./CPackConfig.cmake";
  singleLine.push_back(relConfigFile);
  gti.CommandLines.push_back(singleLine);
  if (this->GetPreinstallTargetName()) {
    gti.Depends.push_back(this->GetPreinstallTargetName());
  } else {
    const char* noPackageAll =
      mf->GetDefinition("CMAKE_SKIP_PACKAGE_ALL_DEPENDENCY");
    if (!noPackageAll || cmSystemTools::IsOff(noPackageAll)) {
      gti.Depends.push_back(this->GetAllTargetName());
    }
  }
  if (cmSystemTools::FileExists(configFile.c_str())) {
    targets.push_back(gti);
  }
}